

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O0

iterator __thiscall JetHead::list<Selector::ListenerNode_*>::iterator::erase(iterator *this)

{
  Node *pNVar1;
  Node *pNVar2;
  long *in_RSI;
  Node *next;
  Node *prev;
  iterator *this_local;
  iterator *ret;
  
  if (((*in_RSI == 0) || (*(long *)(*in_RSI + 8) == 0)) || (*(long *)(*in_RSI + 0x10) == 0)) {
    this->mNode = (Node *)*in_RSI;
  }
  else {
    pNVar1 = *(Node **)(*in_RSI + 0x10);
    pNVar2 = *(Node **)(*in_RSI + 8);
    pNVar1->next = pNVar2;
    pNVar2->prev = pNVar1;
    if ((void *)*in_RSI != (void *)0x0) {
      operator_delete((void *)*in_RSI,0x18);
    }
    *in_RSI = 0;
    this->mNode = pNVar2;
  }
  return (iterator)(Node *)this;
}

Assistant:

iterator erase()
			{
				// Don't segfault, and don't delete head or tail
				// placeholder nodes 
				if (mNode == NULL or 
					mNode->next == NULL or 
					mNode->prev == NULL) 
				{
					return *this;
				}

				Node* prev = mNode->prev;
				Node* next = mNode->next;

				prev->next = next;
				next->prev = prev;

				delete mNode;
				mNode = NULL;

				iterator ret;
				ret.mNode = next;
				return ret;
			}